

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3interp.cpp
# Opt level: O1

void __thiscall w3Interp::i32_Trunc_f32u(w3Interp *this)

{
  float fVar1;
  pointer pwVar2;
  Value *pVVar3;
  
  pVVar3 = w3Stack::value(&this->super_w3Stack,Tag_f32);
  fVar1 = pVVar3->f32;
  w3Stack::AssertTopIsValue(&this->super_w3Stack);
  pwVar2 = (this->super_w3Stack).super_w3StackBase.super_w3StackBaseBase.
           super__Vector_base<w3StackValue,_std::allocator<w3StackValue>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pwVar2[-1].value.tag = Tag_i32;
  pwVar2[-1].value.value.i32 = (int32_t)(long)fVar1;
  return;
}

Assistant:

INTERP (i32_Trunc_f32u)
{
    set_u32 ((uint32_t)f32 ());
}